

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O0

void test_by_char<char,wchar_t>(locale *l,locale *lreal)

{
  long lVar1;
  bool bVar2;
  __type _Var3;
  short sVar4;
  short sVar5;
  _Ios_Iostate _Var6;
  ostream *poVar7;
  undefined8 uVar8;
  money_put *pmVar9;
  money_get *pmVar10;
  void *pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar12;
  ostream *poVar13;
  tm *ptVar14;
  time_put *ptVar15;
  runtime_error *this;
  int iVar16;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  locale *in_RSI;
  locale *in_RDI;
  tm tm;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> rfmt;
  ss_ref_type ss_ref_3;
  time_t a_datetime;
  time_t a_timesec;
  time_t a_time;
  time_t a_date;
  ss_type ss_4;
  ss_ref_type ss_ref_2;
  double v1_1;
  ss_type ss_3;
  double v1;
  ss_type ss_2;
  longdouble tmp;
  iter_type end;
  iostate err;
  ss_ref_type ss_ref_1;
  bool bad_parsing;
  ss_ref_type ss_ref;
  double n_1;
  ss_type ss_1;
  double n;
  ss_type ss;
  add_ftime<char> *fmt;
  undefined2 in_stack_ffffffffffffe800;
  undefined2 uVar17;
  undefined6 in_stack_ffffffffffffe802;
  undefined6 uVar18;
  istream_type *in_stack_ffffffffffffe808;
  string *s;
  runtime_error *in_stack_ffffffffffffe810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe818;
  allocator *paVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe820;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffe8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8c0;
  allocator local_1429;
  string local_1428 [32];
  wstring local_1408 [32];
  string local_13e8 [32];
  undefined8 local_13c8;
  undefined1 local_13c0;
  undefined8 local_13b8;
  undefined4 local_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  long lStack_1380;
  char *local_1378;
  wstring local_1368 [32];
  locale local_1348 [8];
  long local_1340 [49];
  string local_11b8 [96];
  string local_1158 [128];
  long local_10d8 [4];
  locale local_10b8 [8];
  stringstream local_10b0 [16];
  undefined1 local_10a0 [382];
  undefined1 local_f22;
  allocator local_f21;
  string local_f20 [32];
  wstring local_f00 [32];
  string local_ee0 [32];
  undefined8 local_ec0;
  undefined1 local_eb8;
  undefined8 local_eb0;
  undefined4 local_ea8;
  locale local_ea0 [8];
  long local_e98 [2];
  wostream local_e88 [382];
  undefined1 local_d0a;
  allocator local_d09;
  string local_d08 [38];
  undefined1 local_ce2;
  allocator local_ce1;
  string local_ce0 [32];
  double local_cc0;
  undefined1 local_cb2;
  allocator local_cb1;
  string local_cb0 [32];
  locale local_c90 [8];
  long local_c88 [2];
  undefined1 local_c78 [382];
  undefined1 local_afa;
  allocator local_af9;
  string local_af8 [32];
  wstring local_ad8 [32];
  string local_ab8 [32];
  double local_a98;
  undefined1 local_a8a;
  allocator local_a89;
  string local_a88 [32];
  locale local_a68 [8];
  long local_a60 [2];
  undefined1 local_a50 [376];
  undefined1 local_8d8 [12];
  undefined4 local_8c8;
  undefined4 uStack_8c4;
  undefined4 uStack_8c0;
  undefined4 uStack_8bc;
  undefined8 local_8b8;
  undefined4 local_8b0;
  string local_8a8 [16];
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  _Ios_Iostate local_884;
  undefined8 local_880;
  undefined1 local_878;
  undefined8 local_870;
  undefined4 local_868;
  locale local_860 [8];
  long local_858 [2];
  wostream local_848 [381];
  byte local_6cb;
  undefined1 local_6ca;
  allocator local_6c9;
  string local_6c8 [32];
  wstring local_6a8 [32];
  string local_688 [32];
  locale local_668 [8];
  wstringstream local_660 [16];
  wostream local_650 [382];
  undefined1 local_4d2;
  allocator local_4d1;
  string local_4d0 [38];
  undefined1 local_4aa;
  allocator local_4a9;
  string local_4a8 [32];
  double local_488;
  undefined1 local_47a;
  allocator local_479;
  string local_478 [32];
  locale local_458 [8];
  long local_450 [2];
  undefined1 local_440 [382];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [32];
  locale local_2a0 [15];
  allocator local_291;
  string local_290 [32];
  string local_270 [32];
  string local_250 [38];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [32];
  double local_1e0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [48];
  locale local_1a0 [8];
  long local_198 [2];
  undefined1 local_188 [376];
  locale *local_10;
  locale *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::posix");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  std::ostream::operator<<(local_188,1045.45);
  test_counter = test_counter + 1;
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_198 + *(long *)(local_198[0] + -0x18)));
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x48);
    poVar7 = std::operator<<(poVar7," ss");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_1d2 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"Error limits reached, stopping unit test",&local_1d1);
      booster::runtime_error::runtime_error
                (in_stack_ffffffffffffe810,(string *)in_stack_ffffffffffffe808);
      local_1d2 = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::operator>>((istream *)local_198,&local_1e0);
  test_counter = test_counter + 1;
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_198 + *(long *)(local_198[0] + -0x18)));
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4b);
    poVar7 = std::operator<<(poVar7," ss");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_202 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"Error limits reached, stopping unit test",&local_201);
      booster::runtime_error::runtime_error
                (in_stack_ffffffffffffe810,(string *)in_stack_ffffffffffffe808);
      local_202 = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((local_1e0 != 1045.45) || (NAN(local_1e0))) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4c);
    poVar7 = std::operator<<(poVar7," n == 1045.45");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_22a = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"Error limits reached, stopping unit test",&local_229);
      booster::runtime_error::runtime_error
                (in_stack_ffffffffffffe810,(string *)in_stack_ffffffffffffe808);
      local_22a = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"1045.45",&local_291);
  std::locale::locale(local_2a0,local_8);
  to_correct_string<char>
            ((string *)in_stack_ffffffffffffe808,
             (locale *)CONCAT62(in_stack_ffffffffffffe802,in_stack_ffffffffffffe800));
  _Var3 = std::operator==(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  std::__cxx11::string::~string(local_270);
  std::locale::~locale(local_2a0);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string(local_250);
  if (!_Var3) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4d);
    poVar7 = std::operator<<(poVar7," ss.str()==to_correct_string<CharType>(\"1045.45\",l)");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_2c2 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"Error limits reached, stopping unit test",&local_2c1);
      booster::runtime_error::runtime_error
                (in_stack_ffffffffffffe810,(string *)in_stack_ffffffffffffe808);
      local_2c2 = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::number");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::stringstream((stringstream *)local_450);
  std::ios::imbue(local_458);
  std::locale::~locale(local_458);
  std::ostream::operator<<(local_440,booster::locale::as::number);
  std::ostream::operator<<(local_440,1045.45);
  test_counter = test_counter + 1;
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_450 + *(long *)(local_450[0] + -0x18)));
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x5a);
    poVar7 = std::operator<<(poVar7," ss");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_47a = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_478,"Error limits reached, stopping unit test",&local_479);
      booster::runtime_error::runtime_error
                (in_stack_ffffffffffffe810,(string *)in_stack_ffffffffffffe808);
      local_47a = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::operator>>((istream *)local_450,&local_488);
  test_counter = test_counter + 1;
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_450 + *(long *)(local_450[0] + -0x18)));
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x5d);
    poVar7 = std::operator<<(poVar7," ss");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_4aa = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4a8,"Error limits reached, stopping unit test",&local_4a9);
      booster::runtime_error::runtime_error
                (in_stack_ffffffffffffe810,(string *)in_stack_ffffffffffffe808);
      local_4aa = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((local_488 != 1045.45) || (NAN(local_488))) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x5e);
    poVar7 = std::operator<<(poVar7," n == 1045.45");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_4d2 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d0,"Error limits reached, stopping unit test",&local_4d1);
      booster::runtime_error::runtime_error
                (in_stack_ffffffffffffe810,(string *)in_stack_ffffffffffffe808);
      local_4d2 = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::wstringstream(local_660);
  std::wios::imbue(local_668);
  std::locale::~locale(local_668);
  std::wostream::operator<<(local_650,1045.45);
  test_counter = test_counter + 1;
  std::__cxx11::stringstream::str();
  std::__cxx11::wstringstream::str();
  bVar2 = equal<char,wchar_t>(in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8);
  std::__cxx11::wstring::~wstring(local_6a8);
  std::__cxx11::string::~string(local_688);
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x65);
    poVar7 = std::operator<<(poVar7," equal(ss.str(),ss_ref.str())");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_6ca = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6c8,"Error limits reached, stopping unit test",&local_6c9);
      booster::runtime_error::runtime_error
                (in_stack_ffffffffffffe810,(string *)in_stack_ffffffffffffe808);
      local_6ca = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::~wstringstream(local_660);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_450);
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::currency national ");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  local_6cb = 0;
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_858);
  std::wios::imbue(local_860);
  std::locale::~locale(local_860);
  std::wostream::operator<<(local_848,std::showbase);
  pmVar9 = std::
           use_facet<std::__cxx11::money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (local_10);
  std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::ostreambuf_iterator
            ((ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_ffffffffffffe810,
             (ostream_type *)in_stack_ffffffffffffe808);
  uVar17 = (undefined2)((unkuint10)(longdouble)104334.0 >> 0x40);
  local_880 = std::__cxx11::
              money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::put
                        (pmVar9,local_870,local_868,0,
                         (long)local_858 + *(long *)(local_858[0] + -0x18),0x20,
                         SUB108((longdouble)104334.0,0));
  local_884 = _S_goodbit;
  local_878 = extraout_DL;
  std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::istreambuf_iterator
            ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
             CONCAT62(in_stack_ffffffffffffe802,uVar17));
  pmVar10 = std::
            use_facet<std::__cxx11::money_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                      (local_10);
  std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::istreambuf_iterator
            ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_ffffffffffffe810,
             in_stack_ffffffffffffe808);
  local_8c8 = local_898;
  uStack_8c4 = uStack_894;
  uStack_8c0 = uStack_890;
  uStack_8bc = uStack_88c;
  s = local_8a8;
  uVar18 = (undefined6)((ulong)&local_884 >> 0x10);
  local_8d8 = std::__cxx11::
              money_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::get
                        (pmVar10,local_8b8,local_8b0,CONCAT44(uStack_894,local_898),uStack_890,0,
                         (long)local_858 + *(long *)(local_858[0] + -0x18),(short)&local_884);
  _Var6 = std::operator&(local_884,_S_failbit);
  if (_Var6 != _S_goodbit) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "-- Looks like standard library does not support parsing well");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    local_6cb = 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_a60);
  std::ios::imbue(local_a68);
  std::locale::~locale(local_a68);
  std::ostream::operator<<(local_a50,booster::locale::as::currency);
  std::ostream::operator<<(local_a50,1043.34);
  if ((local_6cb & 1) == 0) {
    test_counter = test_counter + 1;
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)local_a60 + *(long *)(local_a60[0] + -0x18)));
    if (!bVar2) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x85);
      poVar7 = std::operator<<(poVar7," ss");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      iVar16 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar16;
      if (bVar2) {
        local_a8a = 1;
        uVar8 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_a88,"Error limits reached, stopping unit test",&local_a89);
        booster::runtime_error::runtime_error(in_stack_ffffffffffffe810,s);
        local_a8a = 0;
        __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::istream::operator>>((istream *)local_a60,&local_a98);
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringstream::str();
  std::__cxx11::wstringstream::str();
  bVar2 = equal<char,wchar_t>(in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8);
  std::__cxx11::wstring::~wstring(local_ad8);
  std::__cxx11::string::~string(local_ab8);
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x8b);
    poVar7 = std::operator<<(poVar7," equal(ss.str(),ss_ref.str())");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_afa = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_af8,"Error limits reached, stopping unit test",&local_af9);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffe810,s);
      local_afa = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_a60);
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_858);
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::currency iso");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::stringstream((stringstream *)local_c88);
  std::ios::imbue(local_c90);
  std::locale::~locale(local_c90);
  pvVar11 = (void *)std::ostream::operator<<(local_c78,booster::locale::as::currency);
  std::ostream::operator<<(pvVar11,booster::locale::as::currency_iso);
  std::ostream::operator<<(local_c78,1043.34);
  test_counter = test_counter + 1;
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_c88 + *(long *)(local_c88[0] + -0x18)));
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x9a);
    poVar7 = std::operator<<(poVar7," ss");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_cb2 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cb0,"Error limits reached, stopping unit test",&local_cb1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffe810,s);
      local_cb2 = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::operator>>((istream *)local_c88,&local_cc0);
  test_counter = test_counter + 1;
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_c88 + *(long *)(local_c88[0] + -0x18)));
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x9d);
    poVar7 = std::operator<<(poVar7," ss");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_ce2 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ce0,"Error limits reached, stopping unit test",&local_ce1);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffe810,s);
      local_ce2 = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if ((local_cc0 != 1043.34) || (NAN(local_cc0))) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x9e);
    poVar7 = std::operator<<(poVar7," v1==1043.34");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_d0a = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d08,"Error limits reached, stopping unit test",&local_d09);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffe810,s);
      local_d0a = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_e98);
  std::wios::imbue(local_ea0);
  std::locale::~locale(local_ea0);
  std::wostream::operator<<(local_e88,std::showbase);
  pmVar9 = std::
           use_facet<std::__cxx11::money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (local_10);
  std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::ostreambuf_iterator
            ((ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_ffffffffffffe810,
             (ostream_type *)s);
  fmt = SUB108((longdouble)104334.0,0);
  uVar17 = (undefined2)((unkuint10)(longdouble)104334.0 >> 0x40);
  local_ec0 = std::__cxx11::
              money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::put
                        (pmVar9,local_eb0,local_ea8,1,
                         (long)local_e98 + *(long *)(local_e98[0] + -0x18),0x20);
  test_counter = test_counter + 1;
  local_eb8 = extraout_DL_00;
  std::__cxx11::stringstream::str();
  std::__cxx11::wstringstream::str();
  bVar2 = equal<char,wchar_t>(in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8);
  std::__cxx11::wstring::~wstring(local_f00);
  std::__cxx11::string::~string(local_ee0);
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xa5);
    poVar7 = std::operator<<(poVar7," equal(ss.str(),ss_ref.str())");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      local_f22 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f20,"Error limits reached, stopping unit test",&local_f21);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffe810,s);
      local_f22 = 0;
      __cxa_throw(uVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_e98);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_c88);
  poVar7 = std::operator<<((ostream *)&std::cout,"- Testing as::date/time");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::stringstream(local_10b0);
  std::ios::imbue(local_10b8);
  std::locale::~locale(local_10b8);
  local_10d8[3] = 0x2e2480;
  local_10d8[2] = 0xdaac;
  local_10d8[1] = 0xd;
  local_10d8[0] = 0x2eff39;
  booster::locale::as::time_zone((char *)in_stack_ffffffffffffe818);
  booster::locale::as::details::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)CONCAT62(uVar18,uVar17),
             (set_timezone *)fmt);
  booster::locale::as::details::set_timezone::~set_timezone((set_timezone *)0x10f1ca);
  pvVar11 = (void *)std::ostream::operator<<(local_10a0,booster::locale::as::date);
  poVar7 = (ostream *)std::ostream::operator<<(pvVar11,local_10d8[0]);
  std::operator<<(poVar7,'\n');
  pvVar11 = (void *)std::ostream::operator<<(local_10a0,booster::locale::as::time);
  poVar7 = (ostream *)std::ostream::operator<<(pvVar11,local_10d8[0]);
  std::operator<<(poVar7,'\n');
  s1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::ostream::operator<<(local_10a0,booster::locale::as::datetime);
  poVar7 = (ostream *)std::ostream::operator<<(s1,local_10d8[0]);
  std::operator<<(poVar7,'\n');
  booster::locale::as::time_zone((char *)in_stack_ffffffffffffe818);
  booster::locale::as::details::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)CONCAT62(uVar18,uVar17),
             (set_timezone *)fmt);
  booster::locale::as::details::set_timezone::~set_timezone((set_timezone *)0x10f307);
  conv_to_char<char>((char *)in_stack_ffffffffffffe818);
  booster::locale::as::ftime<char>(in_stack_ffffffffffffe818);
  pbVar12 = booster::locale::as::details::operator<<
                      ((basic_ostream<char,_std::char_traits<char>_> *)CONCAT62(uVar18,uVar17),fmt);
  poVar13 = (ostream *)std::ostream::operator<<(pbVar12,local_10d8[0]);
  std::operator<<(poVar13,'\n');
  booster::locale::as::details::add_ftime<char>::~add_ftime((add_ftime<char> *)0x10f3a3);
  std::__cxx11::string::~string(local_1158);
  booster::locale::as::time_zone((char *)in_stack_ffffffffffffe818);
  booster::locale::as::details::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)CONCAT62(uVar18,uVar17),
             (set_timezone *)fmt);
  booster::locale::as::details::set_timezone::~set_timezone((set_timezone *)0x10f3fa);
  conv_to_char<char>((char *)in_stack_ffffffffffffe818);
  booster::locale::as::ftime<char>(in_stack_ffffffffffffe818);
  pbVar12 = booster::locale::as::details::operator<<
                      ((basic_ostream<char,_std::char_traits<char>_> *)CONCAT62(uVar18,uVar17),fmt);
  poVar13 = (ostream *)std::ostream::operator<<(pbVar12,local_10d8[0]);
  std::operator<<(poVar13,'\n');
  booster::locale::as::details::add_ftime<char>::~add_ftime((add_ftime<char> *)0x10f496);
  std::__cxx11::string::~string(local_11b8);
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_1340);
  std::wios::imbue(local_1348);
  std::locale::~locale(local_1348);
  conv_to_char<wchar_t>((char *)in_stack_ffffffffffffe818);
  ptVar14 = gmtime(local_10d8);
  local_1378 = ptVar14->tm_zone;
  local_13a8._0_4_ = ptVar14->tm_sec;
  local_13a8._4_4_ = ptVar14->tm_min;
  uStack_13a0._0_4_ = ptVar14->tm_hour;
  uStack_13a0._4_4_ = ptVar14->tm_mday;
  local_1398._0_4_ = ptVar14->tm_mon;
  local_1398._4_4_ = ptVar14->tm_year;
  uStack_1390._0_4_ = ptVar14->tm_wday;
  uStack_1390._4_4_ = ptVar14->tm_yday;
  local_1388 = *(undefined8 *)&ptVar14->tm_isdst;
  lStack_1380 = ptVar14->tm_gmtoff;
  ptVar15 = std::
            use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                      (local_10);
  std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::ostreambuf_iterator
            ((ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)in_stack_ffffffffffffe810,
             (ostream_type *)s);
  lVar1 = *(long *)(local_1340[0] + -0x18);
  uVar8 = std::__cxx11::wstring::c_str();
  sVar4 = std::__cxx11::wstring::c_str();
  sVar5 = std::__cxx11::wstring::size();
  local_13c8 = std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
               put(ptVar15,local_13b8,local_13b0,(long)local_1340 + lVar1,0x20,&local_13a8,uVar8,
                   sVar4 + sVar5 * 4);
  test_counter = test_counter + 1;
  local_13c0 = extraout_DL_01;
  std::__cxx11::stringstream::str();
  std::__cxx11::wstringstream::str();
  bVar2 = equal<char,wchar_t>(s1,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                  *)poVar7);
  std::__cxx11::wstring::~wstring(local_1408);
  std::__cxx11::string::~string(local_13e8);
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xca);
    poVar7 = std::operator<<(poVar7," equal(ss.str(),ss_ref.str())");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    iVar16 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar16;
    if (bVar2) {
      this = (runtime_error *)__cxa_allocate_exception(0x30);
      paVar19 = &local_1429;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1428,"Error limits reached, stopping unit test",paVar19);
      booster::runtime_error::runtime_error(this,s);
      __cxa_throw(this,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstring::~wstring(local_1368);
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_1340);
  std::__cxx11::stringstream::~stringstream(local_10b0);
  return;
}

Assistant:

void test_by_char(std::locale const &l,std::locale const &lreal)
{
    typedef std::basic_stringstream<CharType> ss_type;
    typedef std::basic_stringstream<RefCharType> ss_ref_type;

    using namespace booster::locale;

    {
        std::cout << "- Testing as::posix" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << 1045.45;
        TEST(ss);
        double n;
        ss >> n;
        TEST(ss);
        TEST(n == 1045.45);
        TEST(ss.str()==to_correct_string<CharType>("1045.45",l));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        #endif
    }

    {
        std::cout << "- Testing as::number" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << as::number;
        ss << 1045.45;
        TEST(ss);
        double n;
        ss >> n;
        TEST(ss);
        TEST(n == 1045.45);

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);

        ss_ref << 1045.45;

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }

    {
        std::cout << "- Testing as::currency national " << std::endl;

        bool bad_parsing = false;
        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);
        ss_ref << std::showbase;
        std::use_facet<std::money_put<RefCharType> >(lreal).put(ss_ref,false,ss_ref,RefCharType(' '),104334);
        { // workaround MSVC library issues
            std::ios_base::iostate err=std::ios_base::iostate();
            typename std::money_get<RefCharType>::iter_type end;
            long double tmp;
            std::use_facet<std::money_get<RefCharType> >(lreal).get(ss_ref,end,false,ss_ref,err,tmp);
            if(err & std::ios_base::failbit) {
                std::cout << "-- Looks like standard library does not support parsing well" << std::endl;
                bad_parsing=true;
            }
        }

        ss_type ss;
        ss.imbue(l);

        ss << as::currency;
        ss << 1043.34;
        if(!bad_parsing) {
            TEST(ss);
            double v1;
            ss >> v1;
        }


        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif

    }

    {
        std::cout << "- Testing as::currency iso" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << as::currency << as::currency_iso;
        ss << 1043.34;
        TEST(ss);
        double v1;
        ss >> v1;
        TEST(ss);
        TEST(v1==1043.34);

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);
        ss_ref << std::showbase;
        std::use_facet<std::money_put<RefCharType> >(lreal).put(ss_ref,true,ss_ref,RefCharType(' '),104334);

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }
    
    
    {
        std::cout << "- Testing as::date/time" << std::endl;
        ss_type ss;
        ss.imbue(l);
        
        time_t a_date = 3600*24*(31+4); // Feb 5th
        time_t a_time = 3600*15+60*33; // 15:33:05
        time_t a_timesec = 13;
        time_t a_datetime = a_date + a_time + a_timesec;

        ss << as::time_zone("GMT");

        ss << as::date << a_datetime << CharType('\n');
        ss << as::time << a_datetime << CharType('\n');
        ss << as::datetime << a_datetime << CharType('\n');
        ss << as::time_zone("GMT+01:00");
        ss << as::ftime(conv_to_char<CharType>("%H")) << a_datetime << CharType('\n');
        ss << as::time_zone("GMT+00:15");
        ss << as::ftime(conv_to_char<CharType>("%M")) << a_datetime << CharType('\n');

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);

        std::basic_string<RefCharType> rfmt(conv_to_char<RefCharType>("%x\n%X\n%c\n16\n48\n"));

        std::tm tm=*gmtime(&a_datetime);

        std::use_facet<std::time_put<RefCharType> >(lreal).put(ss_ref,ss_ref,RefCharType(' '),&tm,rfmt.c_str(),rfmt.c_str()+rfmt.size());

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }

}